

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O3

axbStatus_t axbVecMAXPY(axbVec_s *y,size_t num_vecs,axbScalar_s **alpha,axbVec_s **x)

{
  axbStatus_t aVar1;
  size_t sVar2;
  
  if (y->init == 0x1d232) {
    if (num_vecs != 0) {
      sVar2 = 0;
      do {
        if (x[sVar2]->init != 0x1d232) {
          axbVecMAXPY_cold_2();
          goto LAB_00107273;
        }
        sVar2 = sVar2 + 1;
      } while (num_vecs != sVar2);
    }
    (*y->opBackend->op_table[0x14].func)();
    aVar1 = 0;
  }
  else {
    axbVecMAXPY_cold_1();
LAB_00107273:
    aVar1 = 0x1d232;
  }
  return aVar1;
}

Assistant:

axbStatus_t axbVecMAXPY(struct axbVec_s *y, size_t num_vecs, const struct axbScalar_s * const *alpha, const struct axbVec_s * const *x)
{
  AXB_VECTOR_INIT_CHECK(y);
  for (size_t i=0; i<num_vecs; ++i) AXB_VECTOR_INIT_CHECK(x[i]);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_MAXPY];
  axbStatus_t (*op)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*) = (axbStatus_t (*)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*)) op_desc.func;
  op(y, num_vecs, alpha, x, op_desc.func_data);
  return 0;
}